

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::HighestCeilingAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  DVector2 local_38;
  double local_28;
  
  local_38 = *p;
  uVar3 = 0xe0000000;
  uVar4 = 0xc7efffff;
  while ((this->planes[1].Flags & 0x1d0U) == 0x100) {
    dVar1 = sectorPortals.Array[this->Portals[1]].mPlaneZ;
    if (dVar1 < (double)CONCAT44(uVar4,uVar3) || dVar1 == (double)CONCAT44(uVar4,uVar3)) break;
    dVar2 = sectorPortals.Array[this->Portals[1]].mDisplacement.Y + local_38.Y;
    local_38.Y._0_4_ = SUB84(dVar2,0);
    local_38.X = sectorPortals.Array[this->Portals[1]].mDisplacement.X + local_38.X;
    local_38.Y._4_4_ = (int)((ulong)dVar2 >> 0x20);
    local_28 = dVar1;
    this = P_PointInSector(&local_38);
    uVar3 = SUB84(local_28,0);
    uVar4 = (undefined4)((ulong)local_28 >> 0x20);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  dVar1 = secplane_t::ZatPoint(&this->ceilingplane,&local_38);
  return dVar1;
}

Assistant:

double sector_t::HighestCeilingAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = -FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal below where we actually are.
	while (!check->PortalBlocksMovement(ceiling) && planeheight < check->GetPortalPlaneZ(ceiling))
	{
		pos += check->GetPortalDisplacement(ceiling);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->ceilingplane.ZatPoint(pos);
}